

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuSwizzleBlt.c
# Opt level: O3

int SwizzleOffset(SWIZZLE_DESCRIPTOR *pSwizzle,int Pitch,int OffsetX,int OffsetY,int OffsetZ)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  uVar1 = (pSwizzle->Mask).y;
  bVar11 = ""[uVar1 & 0xf] + ""[uVar1 >> 4 & 0xf] + ""[uVar1 >> 8 & 0xf] + ""[uVar1 >> 0xc & 0xf];
  uVar2 = (pSwizzle->Mask).x;
  bVar9 = ""[uVar2 & 0xf] + ""[uVar2 >> 4 & 0xf] + ""[uVar2 >> 8 & 0xf] + ""[uVar2 >> 0xc & 0xf];
  uVar3 = (pSwizzle->Mask).z;
  bVar6 = ""[uVar3 & 0xf] + ""[uVar3 >> 4 & 0xf] + ""[uVar3 >> 8 & 0xf] + ""[uVar3 >> 0xc & 0xf];
  iVar4 = (OffsetX >> (bVar9 & 0x1f)) + (Pitch >> (bVar9 & 0x1f)) * (OffsetY >> (bVar11 & 0x1f)) <<
          (bVar9 + bVar11 + bVar6 & 0x1f);
  uVar15 = uVar2 | uVar1 | uVar3;
  if (1 < (int)uVar15) {
    uVar14 = ~(-1 << (bVar6 & 0x1f)) & OffsetZ;
    uVar8 = ~(-1 << (bVar11 & 0x1f)) & OffsetY;
    uVar13 = ~(-1 << (bVar9 & 0x1f)) & OffsetX;
    bVar6 = 0;
    uVar7 = 1;
    do {
      uVar10 = uVar13 & uVar7 & uVar2;
      uVar13 = uVar13 << (((byte)((int)(uVar7 & uVar2) >> (bVar6 & 0x1f)) ^ 1) & 0x1f);
      uVar12 = uVar7 & uVar1 & uVar8;
      uVar8 = uVar8 << (((byte)((int)(uVar7 & uVar1) >> (bVar6 & 0x1f)) ^ 1) & 0x1f);
      uVar5 = uVar7 & uVar3 & uVar14;
      uVar14 = uVar14 << (((byte)((int)(uVar7 & uVar3) >> (bVar6 & 0x1f)) ^ 1) & 0x1f);
      iVar4 = uVar5 + uVar12 + uVar10 + iVar4;
      bVar6 = bVar6 + 1;
      uVar7 = uVar7 * 2;
    } while ((int)uVar7 < (int)uVar15);
  }
  return iVar4;
}

Assistant:

int SwizzleOffset( // ##########################################################

    /* Return swizzled offset of dimensionally-specified surface byte. */

    const SWIZZLE_DESCRIPTOR    *pSwizzle,  // Pointer to applicable swizzle descriptor.
    int                         Pitch,      // Pointer to applicable surface row-pitch.
    int                         OffsetX,    // Horizontal offset into surface of the target byte, in bytes.
    int                         OffsetY,    // Vertical offset into surface of the target byte, in physical/pitch rows.
    int                         OffsetZ)    // Zero if N/A, or 3D offset into surface of the target byte, in 3D slices or MSAA samples as appropriate.

    /* Given logically-specified (x, y, z) byte within swizzled surface,
    function returns byte's linear/memory offset from surface's base--i.e. it
    performs the swizzled, spatial-to-linear mapping.

    Function makes no real effort to perform optimally, since should only used
    outside loops in CpuSwizzleBlt and similar functions. If any of this
    functionality was needed in performance path, a custom implementation
    should be used that limits itself to functionality specifically needed
    (probably single-dimension, intra-tile offsets) and uses a fast computation
    (e.g. LUT's, hard-codings, PDEP). */

{ // ###########################################################################

    char PDepSupported = -1; // AVX2/BMI2 PDEP (Parallel Deposit) Instruction

    int SwizzledOffset; // Return value being computed.

    int TileWidthBits =  POPCNT16(pSwizzle->Mask.x); // Log2(Tile Width in Bytes)
    int TileHeightBits = POPCNT16(pSwizzle->Mask.y); // Log2(Tile Height)
    int TileDepthBits =  POPCNT16(pSwizzle->Mask.z); // Log2(Tile Depth or MSAA Samples)
    int TileSizeBits =   TileWidthBits + TileHeightBits + TileDepthBits; // Log2(Tile Size in Bytes)
    int TilesPerRow =    Pitch >> TileWidthBits;     // Surface Width in Tiles

    int Row, Col;   // Tile grid position on surface, of tile containing specified byte.
    int x, y, z;    // Position of specified byte within tile that contains it.

    if(PDepSupported == -1)
    {
        #if(_MSC_VER >= 1700)
            #define PDEP(Src, Mask) _pdep_u32((Src), (Mask))
            int CpuInfo[4];
            __cpuidex(CpuInfo, 7, 0);
            PDepSupported = ((CpuInfo[1] & (1 << 8)) != 0); // EBX[8] = BMI2
        #elif ( defined (__BMI2__ ))
            #define PDEP(Src, Mask) _pdep_u32((Src), (Mask))
            unsigned int eax, ebx, ecx, edx;
            __cpuid_count(7, 0, eax, ebx, ecx, edx);
            PDepSupported = ((ebx & (1 << 8)) != 0); // EBX[8] = BMI2
        #else
            #define PDEP(Src, Mask) 0
            PDepSupported = 0;
        #endif
    }

    assert( // Mutually Exclusive Swizzle Positions...
        (pSwizzle->Mask.x | pSwizzle->Mask.y | pSwizzle->Mask.z) ==
        (pSwizzle->Mask.x + pSwizzle->Mask.y + pSwizzle->Mask.z));

    assert( // Swizzle Limited to 16-bit (else expand POPCNT'ing)...
        (pSwizzle->Mask.x | pSwizzle->Mask.y | pSwizzle->Mask.z) < (1 << 16));

    assert( // Pitch is Multiple of Tile Width...
        Pitch == ((Pitch >> TileWidthBits) << TileWidthBits));

    { // Break Positioning into Tile-Granular and Intra-Tile Components...
        assert((OffsetZ >>       TileDepthBits) == 0); // When dealing with 3D tiling, treat as separate single-tile-deep planes.
        z =     OffsetZ & ((1 << TileDepthBits) - 1);

        Row =   OffsetY >>       TileHeightBits;
        y =     OffsetY & ((1 << TileHeightBits) - 1);

        Col =   OffsetX >>       TileWidthBits;
        x =     OffsetX & ((1 << TileWidthBits) - 1);
    }

    SwizzledOffset = // Start with surface offset of given tile...
        (Row * TilesPerRow + Col) << TileSizeBits; // <-- Tiles laid across surface in row-major order.

    // ...then OR swizzled offset of byte within tile...
    if(PDepSupported)
    {
        SwizzledOffset +=
            PDEP(x, pSwizzle->Mask.x) +
            PDEP(y, pSwizzle->Mask.y) +
            PDEP(z, pSwizzle->Mask.z);
    }
    else // PDEP workalike...
    {
        int bitIndex = 0, bitMask = 1;
        int terminationMask = pSwizzle->Mask.x | pSwizzle->Mask.y | pSwizzle->Mask.z;
        while(bitMask < terminationMask)
        {
            int MaskQ;
            #define PROCESS(Q) {                    \
                MaskQ = bitMask & pSwizzle->Mask.Q; \
                SwizzledOffset += Q & MaskQ;        \
                Q <<= 1 ^ (MaskQ >> bitIndex);      \
            }
            PROCESS(x);
            PROCESS(y);
            PROCESS(z);

            bitIndex++;
            bitMask <<= 1;

            #undef PROCESS
        }
    }

    return(SwizzledOffset);
}